

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  size_t sStackY_70;
  char *local_58;
  char *local_40;
  
  iVar5 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_NONE,1);
  if (iVar5 != 0) {
    return -1;
  }
  uVar4 = *exp_idx;
  switch(exp->tokens[uVar4]) {
  case LYXP_TOKEN_PAR1:
    *exp_idx = uVar4 + 1;
    iVar5 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar5 != 0) {
      return -1;
    }
    iVar5 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR2,1);
    if (iVar5 != 0) {
      return -1;
    }
    uVar4 = *exp_idx;
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    *exp_idx = uVar4 + 1;
LAB_00170d5b:
    while( true ) {
      uVar4 = *exp_idx;
      if (exp->used <= uVar4) {
        return 0;
      }
      if (exp->tokens[uVar4] != LYXP_TOKEN_BRACK1) break;
      iVar5 = reparse_predicate(ctx,exp,exp_idx);
      if (iVar5 != 0) {
        return -1;
      }
    }
    if (exp->tokens[uVar4] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    *exp_idx = uVar4 + 1;
switchD_00170cff_caseD_5:
    iVar5 = reparse_relative_location_path(ctx,exp,exp_idx);
    if (iVar5 == 0) {
      return 0;
    }
    return -1;
  default:
    pcVar6 = print_token(exp->tokens[uVar4]);
    ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar6,exp->expr + exp->expr_pos[*exp_idx])
    ;
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    goto switchD_00170cff_caseD_5;
  case LYXP_TOKEN_FUNCNAME:
    iVar5 = exp_check_token(ctx,exp,uVar4,LYXP_TOKEN_FUNCNAME,1);
    if (iVar5 != 0) {
      return -1;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    iVar5 = exp_check_token(ctx,exp,uVar4,LYXP_TOKEN_OPERATOR_PATH,1);
    if (iVar5 != 0) {
      return -1;
    }
    uVar4 = *exp_idx + 1;
    uVar1 = exp->tok_len[*exp_idx];
    *exp_idx = uVar4;
    if (uVar1 == 1) {
      if (exp->used == uVar4) {
        return 0;
      }
      if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar4]) {
        return 0;
      }
      if ((0x6e0U >> (exp->tokens[uVar4] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
          == 0) {
        return 0;
      }
    }
    goto switchD_00170cff_caseD_5;
  }
  uVar7 = 1;
  uVar4 = *exp_idx;
  uVar2 = *(ushort *)((long)exp->tok_len + (ulong)((uint)uVar4 * 2));
  pcVar6 = exp->expr;
  uVar8 = (ulong)*(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar4 * 2));
  switch(uVar2) {
  case 3:
    if (pcVar6[uVar8] == 's') {
      if ((pcVar6[uVar8 + 1] != 'u') || (pcVar6[uVar8 + 2] != 'm')) goto switchD_00170e8d_caseD_e;
    }
    else if ((pcVar6[uVar8] != 'n') || ((pcVar6[uVar8 + 1] != 'o' || (pcVar6[uVar8 + 2] != 't'))))
    goto switchD_00170e8d_caseD_e;
    goto LAB_001713a2;
  case 4:
    pcVar9 = pcVar6 + uVar8;
    iVar5 = strncmp(pcVar9,"lang",4);
    uVar7 = 1;
    if (iVar5 == 0) {
      uVar3 = 1;
      goto LAB_00171316;
    }
    iVar5 = strncmp(pcVar9,"last",4);
    uVar3 = 0;
    if (iVar5 == 0) goto LAB_00171307;
    iVar5 = strncmp(pcVar9,"name",4);
    if (iVar5 == 0) goto LAB_00171316;
    iVar5 = strncmp(pcVar9,"true",4);
    uVar7 = 0;
    goto LAB_001711bd;
  case 5:
    pcVar9 = pcVar6 + uVar8;
    iVar5 = strncmp(pcVar9,"count",5);
    uVar7 = 1;
    uVar3 = 1;
    if (iVar5 == 0) goto LAB_00171316;
    iVar5 = strncmp(pcVar9,"false",5);
    if (iVar5 != 0) {
      iVar5 = strncmp(pcVar9,"floor",5);
      if ((iVar5 == 0) || (iVar5 = strncmp(pcVar9,"round",5), iVar5 == 0)) {
        uVar7 = 1;
        uVar3 = uVar7;
        goto LAB_00171316;
      }
      iVar5 = strncmp(pcVar9,"deref",5);
      uVar7 = 1;
      goto LAB_001711bd;
    }
    goto LAB_00171307;
  case 6:
    iVar5 = strncmp(pcVar6 + uVar8,"concat",6);
    if (iVar5 == 0) goto LAB_001712f6;
    iVar5 = strncmp(pcVar6 + uVar8,"number",6);
    uVar3 = 0;
    if (iVar5 == 0) goto LAB_00171316;
    pcVar9 = "string";
    sStackY_70 = 6;
    goto LAB_0017108a;
  case 7:
    pcVar9 = pcVar6 + uVar8;
    iVar5 = strncmp(pcVar9,"boolean",7);
    uVar7 = 1;
    uVar3 = 1;
    if (iVar5 == 0) goto LAB_00171316;
    iVar5 = strncmp(pcVar9,"ceiling",7);
    uVar7 = 1;
    if (iVar5 == 0) goto LAB_00171316;
    iVar5 = strncmp(pcVar9,"current",7);
    if (iVar5 != 0) goto switchD_00170e8d_caseD_e;
    goto LAB_00171307;
  case 8:
    pcVar9 = pcVar6 + uVar8;
    iVar5 = strncmp(pcVar9,"contains",8);
    uVar7 = 2;
    uVar3 = 2;
    if (iVar5 == 0) goto LAB_00171316;
    iVar5 = strncmp(pcVar9,"position",8);
    if (iVar5 != 0) {
      iVar5 = strncmp(pcVar9,"re-match",8);
      uVar7 = 2;
      goto LAB_001711bd;
    }
LAB_00171307:
    uVar7 = 0;
    uVar3 = 0;
    goto LAB_00171316;
  case 9:
    iVar5 = strncmp(pcVar6 + uVar8,"substring",9);
    if (iVar5 != 0) {
      iVar5 = strncmp(pcVar6 + uVar8,"translate",9);
      if (iVar5 == 0) {
        uVar7 = 3;
        uVar3 = uVar7;
        goto LAB_00171316;
      }
      goto switchD_00170e8d_caseD_e;
    }
LAB_001712f6:
    uVar7 = 3;
    uVar3 = 2;
    goto LAB_00171316;
  case 10:
    iVar5 = strncmp(pcVar6 + uVar8,"local-name",10);
    if (iVar5 == 0) {
LAB_001712ed:
      uVar3 = 0;
      goto LAB_00171316;
    }
    iVar5 = strncmp(pcVar6 + uVar8,"enum-value",10);
    if (iVar5 != 0) {
      pcVar9 = "bit-is-set";
      sStackY_70 = 10;
      goto LAB_0017126e;
    }
LAB_001713a2:
    uVar7 = 1;
    uVar3 = uVar7;
    goto LAB_00171316;
  case 0xb:
    pcVar9 = "starts-with";
    sStackY_70 = 0xb;
    break;
  case 0xc:
    pcVar9 = "derived-from";
    sStackY_70 = 0xc;
    break;
  case 0xd:
    iVar5 = strncmp(pcVar6 + uVar8,"namespace-uri",0xd);
    uVar3 = 0;
    if (iVar5 == 0) goto LAB_00171316;
    pcVar9 = "string-length";
    sStackY_70 = 0xd;
LAB_0017108a:
    uVar3 = 0;
    local_58 = pcVar6 + uVar8;
    iVar5 = strncmp(local_58,pcVar9,sStackY_70);
LAB_001711bd:
    if (iVar5 != 0) goto switchD_00170e8d_caseD_e;
    goto LAB_00171316;
  default:
    goto switchD_00170e8d_caseD_e;
  case 0xf:
    iVar5 = strncmp(pcVar6 + uVar8,"normalize-space",0xf);
    if (iVar5 == 0) goto LAB_001712ed;
    pcVar9 = "substring-after";
    sStackY_70 = 0xf;
LAB_0017126e:
    local_40 = pcVar6 + uVar8;
    iVar5 = strncmp(local_40,pcVar9,sStackY_70);
    goto joined_r0x001712c4;
  case 0x10:
    pcVar9 = "substring-before";
    sStackY_70 = 0x10;
    break;
  case 0x14:
    pcVar9 = "derived-from-or-self";
    sStackY_70 = 0x14;
  }
  iVar5 = strncmp(pcVar6 + uVar8,pcVar9,sStackY_70);
joined_r0x001712c4:
  if (iVar5 != 0) {
switchD_00170e8d_caseD_e:
    ly_vlog(ctx,LYE_XPATH_INFUNC,LY_VLOG_NONE,(void *)0x0,(ulong)uVar2,pcVar6 + uVar8);
    return -1;
  }
  uVar7 = 2;
  uVar3 = uVar7;
LAB_00171316:
  *exp_idx = uVar4 + 1;
  iVar5 = exp_check_token(ctx,exp,uVar4 + 1,LYXP_TOKEN_PAR1,1);
  if (iVar5 == 0) {
    uVar1 = *exp_idx;
    *exp_idx = uVar1 + 1;
    uVar10 = 0;
    iVar5 = exp_check_token(ctx,exp,uVar1 + 1,LYXP_TOKEN_NONE,1);
    if (iVar5 == 0) {
      if (exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2) goto LAB_001713b9;
      iVar5 = reparse_or_expr(ctx,exp,exp_idx);
      uVar10 = 1;
      while (iVar5 == 0) {
LAB_001713b9:
        uVar2 = *exp_idx;
        if ((exp->used <= uVar2) || (exp->tokens[uVar2] != LYXP_TOKEN_COMMA)) {
          iVar5 = exp_check_token(ctx,exp,uVar2,LYXP_TOKEN_PAR2,1);
          if (iVar5 != 0) {
            return -1;
          }
          *exp_idx = *exp_idx + 1;
          if (uVar10 < uVar3 || uVar7 < uVar10) {
            ly_vlog(ctx,LYE_XPATH_INARGCOUNT,LY_VLOG_NONE,(void *)0x0,(ulong)uVar10,
                    (ulong)*(ushort *)((long)exp->tok_len + (ulong)((uint)uVar4 * 2)),
                    exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar4 * 2)));
            return -1;
          }
          goto LAB_00170d5b;
        }
        *exp_idx = uVar2 + 1;
        uVar10 = uVar10 + 1;
        iVar5 = reparse_or_expr(ctx,exp,exp_idx);
      }
    }
  }
  return -1;
}

Assistant:

static int
reparse_path_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*exp_idx);

        if (reparse_or_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
            return -1;
        }
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (reparse_function_call(ctx, exp, exp_idx)) {
            return -1;
        }
        goto predicate;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        if (reparse_absolute_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*exp_idx);
        goto predicate;
        break;
    default:
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        if (reparse_predicate(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* '/' or '//' */
        ++(*exp_idx);

        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}